

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

void __thiscall absl::lts_20240722::Cord::RemoveSuffix(Cord *this,size_t n)

{
  size_t sVar1;
  Nullable<absl::cord_internal::CordRep_*> rep;
  CordzInfo *info;
  CordRep *rep_00;
  CordRepBtree *pCVar2;
  Nullable<CordRep_*> rep_01;
  ulong uVar3;
  CordzUpdateScope scope;
  undefined1 local_e8 [32];
  string death_message;
  AlphaNum local_a8;
  AlphaNum local_78;
  AlphaNum local_48;
  
  sVar1 = InlineRep::size(&this->contents_);
  if (sVar1 < n) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&death_message,"Check n <= size() failed: ",(allocator<char> *)&scope);
    _scope = NullSafeStringView("Requested suffix size ");
    AlphaNum::AlphaNum(&local_48,n);
    local_a8.piece_ = NullSafeStringView(" exceeds Cord\'s size ");
    sVar1 = InlineRep::size(&this->contents_);
    AlphaNum::AlphaNum(&local_78,sVar1);
    absl::lts_20240722::StrCat_abi_cxx11_
              ((AlphaNum *)local_e8,(AlphaNum *)&scope,&local_48,&local_a8);
    std::__cxx11::string::append((string *)&death_message);
    std::__cxx11::string::~string((string *)local_e8);
    (*raw_log_internal::internal_log_function_abi_cxx11_)
              (3,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/strings/cord.cc"
               ,0x2c5,&death_message);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/strings/cord.cc"
                  ,0x2c5,"void absl::Cord::RemoveSuffix(size_t)");
  }
  InlineRep::MaybeRemoveEmptyCrcNode(&this->contents_);
  rep = InlineRep::tree(&this->contents_);
  if (rep == (Nullable<absl::cord_internal::CordRep_*>)0x0) {
    InlineRep::reduce_size(&this->contents_,n);
    return;
  }
  info = cord_internal::InlineData::cordz_info((InlineData *)this);
  cord_internal::CordzUpdateScope::CordzUpdateScope(&scope,info,kRemoveSuffix);
  rep_00 = cord_internal::RemoveCrcNode(rep);
  uVar3 = rep_00->length;
  if (uVar3 <= n) {
    cord_internal::CordRep::Unref(rep_00);
    rep_01 = (Nullable<CordRep_*>)0x0;
    goto LAB_001120be;
  }
  if (rep_00->tag != '\x05') {
    if (rep_00->tag == '\x03') {
      pCVar2 = cord_internal::CordRep::btree(rep_00);
      rep_01 = (Nullable<CordRep_*>)
               absl::lts_20240722::cord_internal::CordRepBtree::RemoveSuffix(pCVar2,n);
      goto LAB_001120be;
    }
    if ((rep_00->refcount).count_.super___atomic_base<int>._M_i == 2) {
      if (rep_00->tag != 1 && rep_00->tag < 6) {
        __assert_fail("tree->IsFlat() || tree->IsSubstring()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/strings/cord.cc"
                      ,0x2d4,"void absl::Cord::RemoveSuffix(size_t)");
      }
      rep_00->length = rep_00->length - n;
      rep_01 = rep_00;
      goto LAB_001120be;
    }
    uVar3 = rep_00->length;
  }
  rep_01 = cord_internal::CordRepSubstring::Substring(rep_00,0,uVar3 - n);
  cord_internal::CordRep::Unref(rep_00);
LAB_001120be:
  InlineRep::SetTreeOrEmpty(&this->contents_,rep_01,&scope);
  cord_internal::CordzUpdateScope::~CordzUpdateScope(&scope);
  return;
}

Assistant:

void Cord::RemoveSuffix(size_t n) {
  ABSL_INTERNAL_CHECK(n <= size(),
                      absl::StrCat("Requested suffix size ", n,
                                   " exceeds Cord's size ", size()));
  contents_.MaybeRemoveEmptyCrcNode();
  CordRep* tree = contents_.tree();
  if (tree == nullptr) {
    contents_.reduce_size(n);
  } else {
    auto constexpr method = CordzUpdateTracker::kRemoveSuffix;
    CordzUpdateScope scope(contents_.cordz_info(), method);
    tree = cord_internal::RemoveCrcNode(tree);
    if (n >= tree->length) {
      CordRep::Unref(tree);
      tree = nullptr;
    } else if (tree->IsBtree()) {
      tree = CordRepBtree::RemoveSuffix(tree->btree(), n);
    } else if (!tree->IsExternal() && tree->refcount.IsOne()) {
      assert(tree->IsFlat() || tree->IsSubstring());
      tree->length -= n;
    } else {
      CordRep* rep = CordRepSubstring::Substring(tree, 0, tree->length - n);
      CordRep::Unref(tree);
      tree = rep;
    }
    contents_.SetTreeOrEmpty(tree, scope);
  }
}